

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O1

bool Js::AsmJsFunctionDeclaration::Is(AsmJsSymbol *sym)

{
  bool bVar1;
  
  if (sym == (AsmJsSymbol *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = sym->mType == ModuleFunction;
    if ((((sym != (AsmJsSymbol *)0x0 && !bVar1) &&
         (bVar1 = sym->mType == FuncPtrTable, sym != (AsmJsSymbol *)0x0 && !bVar1)) &&
        (bVar1 = sym->mType == ImportFunction, sym != (AsmJsSymbol *)0x0 && !bVar1)) &&
       ((bVar1 = sym->mType == MathBuiltinFunction, sym != (AsmJsSymbol *)0x0 && !bVar1 &&
        (bVar1 = sym->mType == TypedArrayBuiltinFunction, sym != (AsmJsSymbol *)0x0 && !bVar1)))) {
      bVar1 = sym->mType == ClosureFunction;
    }
  }
  return bVar1;
}

Assistant:

bool AsmJsFunctionDeclaration::Is(AsmJsSymbol* sym)
    {
        return (
            AsmJsFunc::Is(sym) ||
            AsmJsFunctionTable::Is(sym) ||
            AsmJsImportFunction::Is(sym) ||
            AsmJsMathFunction::Is(sym) ||
            AsmJsTypedArrayFunction::Is(sym) ||
            AsmJsClosureFunction::Is(sym)
        );
    }